

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

void __thiscall wasm::DAE::run(DAE *this,Module *module)

{
  pointer puVar1;
  bool bVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar3;
  key_type local_78;
  undefined1 local_68 [8];
  DAEFunctionInfoMap infoMap;
  
  local_68 = (undefined1  [8])&infoMap._M_h._M_rehash_policy._M_next_resize;
  infoMap._M_h._M_buckets = (__buckets_ptr)0x1;
  infoMap._M_h._M_bucket_count = 0;
  infoMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  infoMap._M_h._M_element_count._0_4_ = 0x3f800000;
  infoMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  infoMap._M_h._M_rehash_policy._4_4_ = 0;
  infoMap._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__detail::
    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)local_68,
                 (key_type *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  }
  local_78.super_IString.str._M_len = 0;
  local_78.super_IString.str._M_str = (char *)0x0;
  std::__detail::
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)local_68,&local_78);
  do {
    bVar2 = iteration(this,module,(DAEFunctionInfoMap *)local_68);
  } while (bVar2);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

void run(Module* module) override {
    DAEFunctionInfoMap infoMap;
    // Ensure all entries exist so the parallel threads don't modify the data
    // structure.
    for (auto& func : module->functions) {
      infoMap[func->name];
    }
    // The null name represents module-level code (not in a function).
    infoMap[Name()];

    // Iterate to convergence.
    while (1) {
      if (!iteration(module, infoMap)) {
        break;
      }
    }
  }